

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtenvironmentvariables.cpp
# Opt level: O3

QString * qEnvironmentVariable(QString *__return_storage_ptr__,char *varName)

{
  long in_FS_OFFSET;
  QString local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.d = (Data *)0x0;
  local_28.d.ptr = (char16_t *)0x0;
  local_28.d.size = 0;
  qEnvironmentVariable(__return_storage_ptr__,varName,&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString qEnvironmentVariable(const char *varName)
{
    return qEnvironmentVariable(varName, QString());
}